

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_internal.hpp
# Opt level: O2

int __thiscall
unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>::cmp
          (basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_> *this,void *param_1,
          void *param_2)

{
  int iVar1;
  
  iVar1 = compare((this->field_0).key._M_ptr,(this->field_0).key._M_extent._M_extent_value,param_1,
                  (size_t)param_2);
  return iVar1;
}

Assistant:

[[nodiscard, gnu::pure]] constexpr int cmp(key_view key2) const noexcept {
    if constexpr (std::is_same_v<KeyType, unodb::key_view>) {
      // variable length keys
      return compare(key, key2);
    } else {
      // fixed width keys
      return compare(&key, sizeof(KeyType), key2.data(), key2.size_bytes());
    }
  }